

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

TFunction * __thiscall
glslang::TParseContext::findFunction120
          (TParseContext *this,TSourceLoc *loc,TFunction *call,bool *builtIn)

{
  TSymbolTable *pTVar1;
  TFunction *pTVar2;
  TType *pTVar3;
  TIntermediate *pTVar4;
  bool bVar5;
  TFunction *pTVar6;
  bool bVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  TBasicType TVar12;
  TBasicType TVar13;
  undefined4 extraout_var;
  TSymbol *pTVar14;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer ppTVar15;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar16;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  int i;
  uint uVar17;
  TFunction *pTVar18;
  TVector<const_glslang::TFunction_*> candidateList;
  TVector<const_glslang::TFunction_*> local_50;
  
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  pTVar14 = TSymbolTable::find(pTVar1,(TString *)CONCAT44(extraout_var,iVar10),builtIn,(bool *)0x0,
                               (int *)0x0);
  if (pTVar14 != (TSymbol *)0x0) {
    iVar10 = (*pTVar14->_vptr_TSymbol[7])(pTVar14);
    return (TFunction *)CONCAT44(extraout_var_00,iVar10);
  }
  TVector<const_glslang::TFunction_*>::TVector(&local_50);
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[6])(call);
  TSymbolTable::findFunctionNameList
            (pTVar1,(TString *)CONCAT44(extraout_var_01,iVar10),&local_50,builtIn);
  pTVar18 = (TFunction *)0x0;
  ppTVar15 = local_50.
             super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
             .
             super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppTVar15 ==
        local_50.
        super_vector<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
        .
        super__Vector_base<const_glslang::TFunction_*,_glslang::pool_allocator<const_glslang::TFunction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (pTVar18 == (TFunction *)0x0) {
        iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"no matching overloaded function found",
                   *(undefined8 *)(CONCAT44(extraout_var_15,iVar10) + 8),"");
      }
      return pTVar18;
    }
    pTVar2 = *ppTVar15;
    iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x24])(call);
    iVar11 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x24])(pTVar2);
    pTVar6 = pTVar18;
    if (iVar10 == iVar11) {
      bVar5 = true;
      for (uVar17 = 0; iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x24])(pTVar2),
          (int)uVar17 < iVar10; uVar17 = uVar17 + 1) {
        iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar17);
        pTVar3 = *(TType **)(CONCAT44(extraout_var_02,iVar10) + 8);
        iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)uVar17);
        bVar7 = TType::operator==(pTVar3,*(TType **)(CONCAT44(extraout_var_03,iVar10) + 8));
        if (!bVar7) {
          iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar17);
          cVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_04,iVar10) + 8) + 0xe8))();
          if (cVar8 != '\0') goto LAB_003aba9a;
          iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)uVar17);
          cVar8 = (**(code **)(**(long **)(CONCAT44(extraout_var_05,iVar10) + 8) + 0xe8))();
          if (cVar8 != '\0') goto LAB_003aba9a;
          iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar17);
          pTVar3 = *(TType **)(CONCAT44(extraout_var_06,iVar10) + 8);
          iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)uVar17);
          bVar7 = TType::sameElementShape
                            (pTVar3,*(TType **)(CONCAT44(extraout_var_07,iVar10) + 8),(int *)0x0,
                             (int *)0x0);
          if (!bVar7) goto LAB_003aba9a;
          iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar17);
          lVar16 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar10) + 8) + 0x50))();
          bVar7 = bVar5;
          if (((*(uint *)(lVar16 + 8) & 0x7f) < 0x14) &&
             ((0xd0000U >> (*(uint *)(lVar16 + 8) & 0x1f) & 1) != 0)) {
            pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)uVar17);
            TVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar10) + 8) + 0x38))();
            iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar17);
            TVar13 = (**(code **)(**(long **)(CONCAT44(extraout_var_10,iVar10) + 8) + 0x38))();
            bVar9 = TIntermediate::canImplicitlyPromote(pTVar4,TVar12,TVar13,EOpNull);
            bVar7 = false;
            if (bVar9) {
              bVar7 = bVar5;
            }
          }
          iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar17);
          lVar16 = (**(code **)(**(long **)(CONCAT44(extraout_var_11,iVar10) + 8) + 0x50))();
          bVar5 = bVar7;
          if ((*(uint *)(lVar16 + 8) & 0x7f) - 0x11 < 2) {
            pTVar4 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            iVar10 = (*(pTVar2->super_TSymbol)._vptr_TSymbol[0x28])(pTVar2,(ulong)uVar17);
            TVar12 = (**(code **)(**(long **)(CONCAT44(extraout_var_12,iVar10) + 8) + 0x38))();
            iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[0x28])(call,(ulong)uVar17);
            TVar13 = (**(code **)(**(long **)(CONCAT44(extraout_var_13,iVar10) + 8) + 0x38))();
            bVar9 = TIntermediate::canImplicitlyPromote(pTVar4,TVar12,TVar13,EOpNull);
            bVar5 = false;
            if (bVar9) {
              bVar5 = bVar7;
            }
          }
          if (!bVar5) break;
        }
      }
      if ((bVar5) && (pTVar6 = pTVar2, pTVar18 != (TFunction *)0x0)) {
        iVar10 = (*(call->super_TSymbol)._vptr_TSymbol[3])(call);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,
                   "ambiguous function signature match: multiple signatures match under implicit type conversion"
                   ,*(undefined8 *)(CONCAT44(extraout_var_14,iVar10) + 8),"");
        pTVar6 = pTVar18;
      }
    }
LAB_003aba9a:
    pTVar18 = pTVar6;
    ppTVar15 = ppTVar15 + 1;
  } while( true );
}

Assistant:

const TFunction* TParseContext::findFunction120(const TSourceLoc& loc, const TFunction& call, bool& builtIn)
{
    // first, look for an exact match
    TSymbol* symbol = symbolTable.find(call.getMangledName(), &builtIn);
    if (symbol)
        return symbol->getAsFunction();

    // exact match not found, look through a list of overloaded functions of the same name

    // "If no exact match is found, then [implicit conversions] will be applied to find a match. Mismatched types
    // on input parameters (in or inout or default) must have a conversion from the calling argument type to the
    // formal parameter type. Mismatched types on output parameters (out or inout) must have a conversion
    // from the formal parameter type to the calling argument type.  When argument conversions are used to find
    // a match, it is a semantic error if there are multiple ways to apply these conversions to make the call match
    // more than one function."

    const TFunction* candidate = nullptr;
    TVector<const TFunction*> candidateList;
    symbolTable.findFunctionNameList(call.getMangledName(), candidateList, builtIn);

    for (auto it = candidateList.begin(); it != candidateList.end(); ++it) {
        const TFunction& function = *(*it);

        // to even be a potential match, number of arguments has to match
        if (call.getParamCount() != function.getParamCount())
            continue;

        bool possibleMatch = true;
        for (int i = 0; i < function.getParamCount(); ++i) {
            // same types is easy
            if (*function[i].type == *call[i].type)
                continue;

            // We have a mismatch in type, see if it is implicitly convertible

            if (function[i].type->isArray() || call[i].type->isArray() ||
                ! function[i].type->sameElementShape(*call[i].type))
                possibleMatch = false;
            else {
                // do direction-specific checks for conversion of basic type
                if (function[i].type->getQualifier().isParamInput()) {
                    if (! intermediate.canImplicitlyPromote(call[i].type->getBasicType(), function[i].type->getBasicType()))
                        possibleMatch = false;
                }
                if (function[i].type->getQualifier().isParamOutput()) {
                    if (! intermediate.canImplicitlyPromote(function[i].type->getBasicType(), call[i].type->getBasicType()))
                        possibleMatch = false;
                }
            }
            if (! possibleMatch)
                break;
        }
        if (possibleMatch) {
            if (candidate) {
                // our second match, meaning ambiguity
                error(loc, "ambiguous function signature match: multiple signatures match under implicit type conversion", call.getName().c_str(), "");
            } else
                candidate = &function;
        }
    }

    if (candidate == nullptr)
        error(loc, "no matching overloaded function found", call.getName().c_str(), "");

    return candidate;
}